

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall MobileElementManager::Delete(MobileElementManager *this,int index)

{
  bool bVar1;
  runtime_error *this_00;
  
  this->prop_sum_ =
       this->prop_sum_ -
       (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[index];
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(this->polymerases_).
                                 super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[index].first.
                                 super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18),"__rnase");
  if (bVar1) {
    this->pol_count_ = this->pol_count_ + -1;
  }
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::erase(&this->polymerases_,
          (this->polymerases_).
          super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + index);
  std::vector<double,_std::allocator<double>_>::erase
            (&this->prop_list_,
             (const_iterator)
             ((this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + index));
  if ((long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Prop list not correct size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Delete(int index) {
  prop_sum_ -= prop_list_[index];
  // Keep running count of non-RNAse mobile elements
  if (polymerases_[index].first->name() != "__rnase") {
    pol_count_ -= 1;
  }
  polymerases_.erase(polymerases_.begin() + index);
  prop_list_.erase(prop_list_.begin() + index);
  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
}